

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::Serialize
          (Serializer<(Diligent::SerializerMode)0> *this,SerializedData *Data)

{
  bool bVar1;
  void *pData;
  void *Ptr;
  size_t Size;
  SerializedData local_38;
  
  Size = 0;
  Ptr = (void *)0x0;
  bVar1 = SerializeBytes(this,&Ptr,&Size,8);
  if (bVar1) {
    pData = (void *)Size;
    if (Size != 0) {
      pData = Ptr;
    }
    SerializedData::SerializedData(&local_38,pData,Size);
    SerializedData::operator=(Data,&local_38);
    SerializedData::~SerializedData(&local_38);
  }
  return bVar1;
}

Assistant:

inline bool Serializer<SerializerMode::Read>::Serialize(SerializedData& Data)
{
    size_t      Size = 0;
    const void* Ptr  = nullptr;
    if (!SerializeBytes(Ptr, Size))
        return false;
    Data = SerializedData{Size > 0 ? const_cast<void*>(Ptr) : nullptr, Size};
    return true;
}